

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void recalculate_it_envelope_node(IT_PLAYING_ENVELOPE *pe,IT_ENVELOPE *e)

{
  uint i;
  uint pt;
  int envpos;
  IT_ENVELOPE *e_local;
  IT_PLAYING_ENVELOPE *pe_local;
  
  pt = e->n_nodes - 1;
  i = 0;
  do {
    if (e->n_nodes - 1 <= i) {
LAB_008622b1:
      pe->next_node = pt;
      return;
    }
    if (pe->tick <= (int)(uint)e->node_t[i]) {
      pt = i;
      goto LAB_008622b1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

static void recalculate_it_envelope_node(IT_PLAYING_ENVELOPE *pe, IT_ENVELOPE *e)
{
	int envpos = pe->tick;
	unsigned int pt = e->n_nodes - 1;
	unsigned int i;
	for (i = 0; i < (unsigned int)(e->n_nodes - 1); ++i)
	{
		if (envpos <= e->node_t[i])
		{
			pt = i;
			break;
		}
	}
	pe->next_node = pt;
}